

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzsparseblockdiagonal.cpp
# Opt level: O0

void __thiscall
TPZSparseBlockDiagonal<float>::Gather
          (TPZSparseBlockDiagonal<float> *this,TPZFMatrix<float> *in,TPZFMatrix<float> *out)

{
  int64_t iVar1;
  int64_t iVar2;
  long *plVar3;
  float *pfVar4;
  TPZBaseMatrix *in_RSI;
  long in_RDI;
  float extraout_XMM0_Da;
  int64_t ic;
  int64_t ieq;
  int64_t nc;
  int64_t neq;
  long row;
  TPZFMatrix<float> *this_00;
  
  iVar1 = TPZVec<long>::NElements((TPZVec<long> *)(in_RDI + 0x80));
  iVar2 = TPZBaseMatrix::Cols(in_RSI);
  for (row = 0; row < iVar2; row = row + 1) {
    for (this_00 = (TPZFMatrix<float> *)0x0; (long)this_00 < iVar1;
        this_00 = (TPZFMatrix<float> *)
                  ((long)&(this_00->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable.
                          _vptr_TPZSavable + 1)) {
      plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x80),(int64_t)this_00);
      (*(in_RSI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RSI,*plVar3,row);
      pfVar4 = TPZFMatrix<float>::operator()(this_00,row,in_RDI);
      *pfVar4 = extraout_XMM0_Da;
    }
  }
  return;
}

Assistant:

void TPZSparseBlockDiagonal<TVar>::Gather(const TPZFMatrix<TVar> &in, TPZFMatrix<TVar> &out) const
{
    int64_t neq = fBlock.NElements();
    int64_t nc = in.Cols();
    int64_t ieq,ic;
    for(ic=0; ic<nc; ic++)
    {
		for(ieq=0; ieq<neq; ieq++) out(ieq,ic) = in.GetVal(fBlock[ieq],ic);
    }
}